

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v11::detail::
for_each_codepoint<fmt::v11::detail::compute_width(fmt::v11::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  detail *pdVar6;
  byte *pbVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  detail *pdVar14;
  string_view sVar15;
  string_view sVar16;
  char buf [7];
  anon_class_8_1_54a39806 decode;
  undefined4 local_48;
  undefined3 uStack_44;
  count_code_points local_40;
  char *local_38;
  
  pcVar9 = s.data_;
  local_40.count = (size_t *)s.size_;
  pcVar10 = pcVar9;
  pdVar14 = this;
  if (pcVar9 < (char *)0x4) {
LAB_001a533f:
    lVar5 = (long)(this + (long)pcVar10) - (long)pdVar14;
    if (lVar5 != 0) {
      lVar4 = 0;
      uStack_44 = 0;
      local_48 = 0;
      do {
        *(detail *)((long)&local_48 + lVar4) = pdVar14[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
      pbVar7 = (byte *)&local_48;
      do {
        uVar8 = (uint)(*pbVar7 >> 3);
        lVar4 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar8];
        uVar11 = (pbVar7[3] & 0x3f |
                 (pbVar7[2] & 0x3f) << 6 |
                 (pbVar7[1] & 0x3f) << 0xc |
                 ((uint)*pbVar7 & *(uint *)(&DAT_00223b90 + lVar4 * 4)) << 0x12) >>
                 ((&DAT_00223bd0)[lVar4 * 4] & 0x1f);
        uVar12 = ((pbVar7[1] >> 2 & 0xfffffff0) + (uint)(pbVar7[2] >> 6) * 4 |
                  (uint)(pbVar7[3] >> 6) |
                  (uint)(uVar11 < *(uint *)(&DAT_00223bb0 + lVar4 * 4)) << 6 |
                  (uint)(0x10ffff < uVar11) << 8 | (uint)((uVar11 & 0x7ffff800) == 0xd800) << 7) ^
                 0x2a;
        if (uVar12 >> ((&DAT_00223bf0)[lVar4 * 4] & 0x1f) == 0) {
          uVar3 = (ulong)((0x80ff0000U >> uVar8 & 1) != 0);
          pbVar13 = pbVar7 + lVar4 + uVar3;
          sVar2 = uVar3 + lVar4;
        }
        else {
          pbVar13 = pbVar7 + 1;
          sVar2 = 1;
        }
        sVar16.size_ = sVar2;
        sVar16.data_ = (char *)pdVar14;
        bVar1 = anon_func::count_code_points::operator()
                          (&local_40,
                           -(uint)(uVar12 >> ((&DAT_00223bf0)[lVar4 * 4] & 0x1f) != 0) | uVar11,
                           sVar16);
        if (bVar1) {
          lVar4 = (long)pbVar13 - (long)pbVar7;
        }
        else {
          lVar4 = 0;
        }
        pdVar14 = pdVar14 + lVar4;
      } while ((bVar1) && (pbVar7 = pbVar13, pbVar13 < (byte *)((long)&local_48 + lVar5)));
    }
  }
  else {
    local_38 = pcVar9;
    do {
      pcVar10 = local_38;
      if ((detail *)(pcVar9 + (long)this + -3) <= pdVar14) goto LAB_001a533f;
      uVar8 = (uint)((byte)*pdVar14 >> 3);
      lVar5 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar8];
      uVar11 = ((byte)pdVar14[3] & 0x3f |
               ((byte)pdVar14[2] & 0x3f) << 6 |
               ((byte)pdVar14[1] & 0x3f) << 0xc |
               ((uint)(byte)*pdVar14 & *(uint *)(&DAT_00223b90 + lVar5 * 4)) << 0x12) >>
               ((&DAT_00223bd0)[lVar5 * 4] & 0x1f);
      uVar12 = (((byte)pdVar14[1] >> 2 & 0xfffffff0) + (uint)((byte)pdVar14[2] >> 6) * 4 |
                (uint)((byte)pdVar14[3] >> 6) |
                (uint)(uVar11 < *(uint *)(&DAT_00223bb0 + lVar5 * 4)) << 6 |
                (uint)(0x10ffff < uVar11) << 8 | (uint)((uVar11 & 0x7ffff800) == 0xd800) << 7) ^
               0x2a;
      if (uVar12 >> ((&DAT_00223bf0)[lVar5 * 4] & 0x1f) == 0) {
        uVar3 = (ulong)((0x80ff0000U >> uVar8 & 1) != 0);
        pdVar6 = pdVar14 + lVar5 + uVar3;
        sVar2 = uVar3 + lVar5;
      }
      else {
        pdVar6 = pdVar14 + 1;
        sVar2 = 1;
      }
      sVar15.size_ = sVar2;
      sVar15.data_ = (char *)pdVar14;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_40,
                         -(uint)(uVar12 >> ((&DAT_00223bf0)[lVar5 * 4] & 0x1f) != 0) | uVar11,sVar15
                        );
      pdVar14 = pdVar6;
    } while (bVar1);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };

  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  auto num_chars_left = to_unsigned(s.data() + s.size() - p);
  if (num_chars_left == 0) return;

  // Suppress bogus -Wstringop-overflow.
  if (FMT_GCC_VERSION) num_chars_left &= 3;
  char buf[2 * block_size - 1] = {};
  copy<char>(p, p + num_chars_left, buf);
  const char* buf_ptr = buf;
  do {
    auto end = decode(buf_ptr, p);
    if (!end) return;
    p += end - buf_ptr;
    buf_ptr = end;
  } while (buf_ptr < buf + num_chars_left);
}